

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O2

void __thiscall ezc3d::c3d::frame(c3d *this,Frame *f,size_t idx,bool skipInternalUpdates)

{
  Parameters *pPVar1;
  int iVar2;
  Group *pGVar3;
  Parameter *pPVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  Points *pPVar6;
  size_t sVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  vector<double,_std::allocator<double>_> *pvVar8;
  Analogs *pAVar9;
  SubFrame *this_00;
  runtime_error *prVar10;
  undefined3 in_register_00000009;
  long lVar11;
  ulong uVar12;
  size_t i;
  size_t sVar13;
  ulong uVar14;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  double local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  
  DataNS::Data::frame((this->_data).
                      super___shared_ptr<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,f,
                      idx);
  if (CONCAT31(in_register_00000009,skipInternalUpdates) == 0) {
    pPVar1 = (this->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"POINT",(allocator<char> *)&labels);
    pGVar3 = ParametersNS::Parameters::group(pPVar1,&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"USED",&local_9a);
    pPVar4 = ParametersNS::GroupNS::Group::parameter(pGVar3,&local_78);
    pvVar5 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar4);
    sVar13 = (size_t)*(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    if (sVar13 != 0) {
      pPVar6 = DataNS::Frame::points(f);
      sVar7 = DataNS::Points3dNS::Points::nbPoints(pPVar6);
      if (sVar7 != sVar13) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar10,
                   "Number of points in POINT:USED parameter must equal to the number of points sent in the frame"
                  );
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pPVar1 = (this->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"POINT",&local_9a);
    pGVar3 = ParametersNS::Parameters::group(pPVar1,&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"LABELS",&local_99);
    pPVar4 = ParametersNS::GroupNS::Group::parameter(pGVar3,&local_78);
    __x = ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_(pPVar4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&labels,__x);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    pointNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_98,this);
    for (uVar14 = 0;
        uVar14 < (ulong)((long)labels.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)labels.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar14 = uVar14 + 1)
    {
      lVar11 = 0;
      uVar12 = 0xffffffffffffffff;
      do {
        uVar12 = uVar12 + 1;
        if ((ulong)((long)(local_98._M_string_length - (long)local_98._M_dataplus._M_p) >> 5) <=
            uVar12) break;
        iVar2 = std::__cxx11::string::compare((string *)(local_98._M_dataplus._M_p + lVar11));
        lVar11 = lVar11 + 0x20;
      } while (iVar2 != 0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
    pPVar6 = DataNS::Frame::points(f);
    sVar13 = DataNS::Points3dNS::Points::nbPoints(pPVar6);
    if (sVar13 != 0) {
      pPVar1 = (this->_parameters).
               super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"POINT",&local_9a);
      pGVar3 = ParametersNS::Parameters::group(pPVar1,&local_98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"RATE",&local_99);
      pPVar4 = ParametersNS::GroupNS::Group::parameter(pGVar3,&local_78);
      pvVar8 = ParametersNS::GroupNS::Parameter::valuesAsDouble(pPVar4);
      local_50 = *(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      if ((local_50 == 0.0) && (!NAN(local_50))) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar10,"Point frame rate must be specified if you add some");
        goto LAB_001216b7;
      }
    }
    pAVar9 = DataNS::Frame::analogs(f);
    sVar13 = DataNS::AnalogsNS::Analogs::nbSubframes(pAVar9);
    if (sVar13 != 0) {
      pPVar1 = (this->_parameters).
               super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"ANALOG",&local_9a);
      pGVar3 = ParametersNS::Parameters::group(pPVar1,&local_98);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"RATE",&local_99);
      pPVar4 = ParametersNS::GroupNS::Group::parameter(pGVar3,&local_78);
      pvVar8 = ParametersNS::GroupNS::Parameter::valuesAsDouble(pPVar4);
      local_50 = *(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      if ((local_50 == 0.0) && (!NAN(local_50))) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar10,"Analog frame rate must be specified if you add some");
LAB_001216b7:
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pPVar1 = (this->_parameters).
             super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"ANALOG",&local_9a);
    pGVar3 = ParametersNS::Parameters::group(pPVar1,&local_98);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"USED",&local_99);
    pPVar4 = ParametersNS::GroupNS::Group::parameter(pGVar3,&local_78);
    pvVar5 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar4);
    iVar2 = *(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    pAVar9 = DataNS::Frame::analogs(f);
    sVar13 = DataNS::AnalogsNS::Analogs::nbSubframes(pAVar9);
    if (sVar13 != 0) {
      pAVar9 = DataNS::Frame::analogs(f);
      this_00 = DataNS::AnalogsNS::Analogs::subframe(pAVar9,0);
      sVar13 = DataNS::AnalogsNS::SubFrame::nbChannels(this_00);
      sVar7 = Header::nbAnalogByFrame
                        ((this->_header).
                         super___shared_ptr<ezc3d::Header,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if ((sVar13 != (long)iVar2) && (iVar2 != 0 || sVar7 != 0)) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar10,
                   "Number of analogs in ANALOG:USED parameter must equal the number of analogs sent in the frame"
                  );
        __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    updateParameters(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_98,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&labels);
  }
  return;
}

Assistant:

void ezc3d::c3d::frame(const ezc3d::DataNS::Frame &f, size_t idx,
                       bool skipInternalUpdates) {

  // Replace the jth frame
  _data->frame(f, idx);

  if (skipInternalUpdates)
    return;

  // Make sure f.points().points() is the same as data.f[ANY].points()
  size_t nPoints(static_cast<size_t>(
      parameters().group("POINT").parameter("USED").valuesAsInt()[0]));
  if (nPoints != 0 && f.points().nbPoints() != nPoints)
    throw std::runtime_error(
        "Number of points in POINT:USED parameter must equal to "
        "the number of points sent in the frame");

  std::vector<std::string> labels(
      parameters().group("POINT").parameter("LABELS").valuesAsString());

  try {
    // Check if all the labels are in the actual LABELSX parameter
    const std::vector<std::string> &namesParameter(pointNames());
    for (size_t i = 0; i < labels.size(); ++i) {
      for (size_t i = 0; i < namesParameter.size(); ++i) {
        if (!namesParameter[i].compare(labels[i])) {
          break;
        }
      }
    }
  } catch (const std::invalid_argument&) {
    throw std::invalid_argument("All the points in the frame must appear "
                                "in the POINT:LABELS parameter");
  }

  if (f.points().nbPoints() > 0 &&
      parameters().group("POINT").parameter("RATE").valuesAsDouble()[0] ==
          0.0) {
    throw std::runtime_error(
        "Point frame rate must be specified if you add some");
  }
  if (f.analogs().nbSubframes() > 0 &&
      parameters().group("ANALOG").parameter("RATE").valuesAsDouble()[0] ==
          0.0) {
    throw std::runtime_error(
        "Analog frame rate must be specified if you add some");
  }

  size_t nAnalogs(static_cast<size_t>(
      parameters().group("ANALOG").parameter("USED").valuesAsInt()[0]));
  size_t subSize(f.analogs().nbSubframes());
  if (subSize != 0) {
    size_t nChannel(f.analogs().subframe(0).nbChannels());
    size_t nAnalogByFrames(header().nbAnalogByFrame());
    if (!(nAnalogs == 0 && nAnalogByFrames == 0) && nChannel != nAnalogs)
      throw std::runtime_error(
          "Number of analogs in ANALOG:USED parameter must equal "
          "the number of analogs sent in the frame");
  }

  // Finalize the internal structure
  updateParameters();
}